

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcIf.c
# Opt level: O2

Hop_Obj_t * Abc_NodeBuildFromMiniInt(Hop_Man_t *pMan,Vec_Int_t *vAig,int nLeaves)

{
  int iVar1;
  int Lit;
  int Lit_00;
  int i;
  int i_00;
  uint uVar2;
  uint uVar3;
  Hop_Obj_t *pHVar4;
  Hop_Obj_t *pHVar5;
  ulong uVar6;
  
  iVar1 = vAig->nSize;
  uVar6 = (ulong)iVar1;
  if ((long)uVar6 < 1) {
    __assert_fail("Vec_IntSize(vAig) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcIf.c"
                  ,0x17c,"Hop_Obj_t *Abc_NodeBuildFromMiniInt(Hop_Man_t *, Vec_Int_t *, int)");
  }
  if (1 < vAig->pArray[uVar6 - 1]) {
    __assert_fail("Vec_IntEntryLast(vAig) < 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcIf.c"
                  ,0x17d,"Hop_Obj_t *Abc_NodeBuildFromMiniInt(Hop_Man_t *, Vec_Int_t *, int)");
  }
  if (iVar1 == 2) {
    iVar1 = Vec_IntEntry(vAig,0);
    if (iVar1 != 0) {
      __assert_fail("Vec_IntEntry(vAig, 0) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcIf.c"
                    ,0x185,"Hop_Obj_t *Abc_NodeBuildFromMiniInt(Hop_Man_t *, Vec_Int_t *, int)");
    }
    if (nLeaves != 1) {
      __assert_fail("nLeaves == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcIf.c"
                    ,0x186,"Hop_Obj_t *Abc_NodeBuildFromMiniInt(Hop_Man_t *, Vec_Int_t *, int)");
    }
    pHVar4 = Hop_IthVar(pMan,0);
    iVar1 = Vec_IntEntry(vAig,1);
    pHVar4 = (Hop_Obj_t *)((long)iVar1 ^ (ulong)pHVar4);
  }
  else if (iVar1 == 1) {
    if (nLeaves != 0) {
      __assert_fail("nLeaves == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcIf.c"
                    ,0x180,"Hop_Obj_t *Abc_NodeBuildFromMiniInt(Hop_Man_t *, Vec_Int_t *, int)");
    }
    pHVar4 = pMan->pConst1;
    iVar1 = Vec_IntEntry(vAig,0);
    pHVar4 = (Hop_Obj_t *)((long)iVar1 ^ (ulong)pHVar4 ^ 1);
  }
  else {
    if ((uVar6 & 1) == 0) {
      __assert_fail("Vec_IntSize(vAig) & 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcIf.c"
                    ,0x18d,"Hop_Obj_t *Abc_NodeBuildFromMiniInt(Hop_Man_t *, Vec_Int_t *, int)");
    }
    iVar1 = 0;
    pHVar4 = (Hop_Obj_t *)0x0;
    while( true ) {
      if ((int)uVar6 <= iVar1 + 1) break;
      Lit = Vec_IntEntry(vAig,iVar1);
      Lit_00 = Vec_IntEntry(vAig,iVar1 + 1);
      i = Abc_Lit2Var(Lit);
      i_00 = Abc_Lit2Var(Lit_00);
      if (i < nLeaves) {
        pHVar4 = Hop_IthVar(pMan,i);
      }
      else {
        pHVar4 = (Hop_Obj_t *)Vec_PtrEntry((Vec_Ptr_t *)vAig,i - nLeaves);
      }
      uVar2 = Abc_LitIsCompl(Lit);
      if (i_00 < nLeaves) {
        pHVar5 = Hop_IthVar(pMan,i_00);
      }
      else {
        pHVar5 = (Hop_Obj_t *)Vec_PtrEntry((Vec_Ptr_t *)vAig,i_00 - nLeaves);
      }
      uVar3 = Abc_LitIsCompl(Lit_00);
      pHVar4 = Hop_And(pMan,(Hop_Obj_t *)((ulong)uVar2 ^ (ulong)pHVar4),
                       (Hop_Obj_t *)((ulong)uVar3 ^ (ulong)pHVar5));
      uVar2 = Abc_Lit2Var(iVar1);
      uVar6 = (ulong)(uint)vAig->nSize;
      if (vAig->nSize <= (int)uVar2) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                      ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
      }
      *(Hop_Obj_t **)(vAig->pArray + (ulong)uVar2 * 2) = pHVar4;
      iVar1 = iVar1 + 2;
    }
    if (iVar1 != (int)uVar6 + -1) {
      __assert_fail("i == Vec_IntSize(vAig) - 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcIf.c"
                    ,0x198,"Hop_Obj_t *Abc_NodeBuildFromMiniInt(Hop_Man_t *, Vec_Int_t *, int)");
    }
    iVar1 = Vec_IntEntry(vAig,iVar1);
    pHVar4 = (Hop_Obj_t *)((long)iVar1 ^ (ulong)pHVar4);
    vAig->nSize = 0;
  }
  return pHVar4;
}

Assistant:

Hop_Obj_t * Abc_NodeBuildFromMiniInt( Hop_Man_t * pMan, Vec_Int_t * vAig, int nLeaves )
{
    assert( Vec_IntSize(vAig) > 0 );
    assert( Vec_IntEntryLast(vAig) < 2 );
    if ( Vec_IntSize(vAig) == 1 ) // const
    {
        assert( nLeaves == 0 );
        return Hop_NotCond( Hop_ManConst0(pMan), Vec_IntEntry(vAig, 0) );
    }
    if ( Vec_IntSize(vAig) == 2 ) // variable
    {
        assert( Vec_IntEntry(vAig, 0) == 0 );
        assert( nLeaves == 1 );
        return Hop_NotCond( Hop_IthVar(pMan, 0), Vec_IntEntry(vAig, 1) );
    }
    else
    {
        int i, iVar0, iVar1, iLit0, iLit1;
        Hop_Obj_t * piLit0, * piLit1, * piLit = NULL;
        assert( Vec_IntSize(vAig) & 1 );
        Vec_IntForEachEntryDouble( vAig, iLit0, iLit1, i )
        {
            iVar0 = Abc_Lit2Var( iLit0 );
            iVar1 = Abc_Lit2Var( iLit1 );
            piLit0 = Hop_NotCond( iVar0 < nLeaves ? Hop_IthVar(pMan, iVar0) : (Hop_Obj_t *)Vec_PtrEntry((Vec_Ptr_t *)vAig, iVar0 - nLeaves), Abc_LitIsCompl(iLit0) );
            piLit1 = Hop_NotCond( iVar1 < nLeaves ? Hop_IthVar(pMan, iVar1) : (Hop_Obj_t *)Vec_PtrEntry((Vec_Ptr_t *)vAig, iVar1 - nLeaves), Abc_LitIsCompl(iLit1) );
            piLit  = Hop_And( pMan, piLit0, piLit1 );
            assert( (i & 1) == 0 );
            Vec_PtrWriteEntry( (Vec_Ptr_t *)vAig, Abc_Lit2Var(i), piLit );  // overwriting entries
        }
        assert( i == Vec_IntSize(vAig) - 1 );
        piLit = Hop_NotCond( piLit, Vec_IntEntry(vAig, i) );
        Vec_IntClear( vAig ); // useless
        return piLit;
    }
}